

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  byte *pbVar1;
  int iVar2;
  code *pcVar3;
  uint uVar4;
  TValue *pTVar5;
  ulong uVar6;
  void *pvVar7;
  TValue *pTVar8;
  TValue *pTVar9;
  
  pvVar7 = L->cframe;
  if (pvVar7 != (void *)0x0) {
    pTVar8 = L->base + -1;
    pTVar9 = (TValue *)(ulong)(L->stack).ptr32;
    do {
      iVar2 = *(int *)(((ulong)pvVar7 & 0xfffffffffffffffc) + 0x10);
      if ((iVar2 < 0) && (pTVar5 = (TValue *)((ulong)(uint)-iVar2 + (long)pTVar9), pTVar8 < pTVar5))
      {
        if (errcode == 0) {
          return pvVar7;
        }
        L->base = pTVar8 + 1;
        L->cframe = *(void **)((long)pvVar7 + 0x30);
        pTVar8 = pTVar5;
LAB_00113bcd:
        unwindstack(L,pTVar8);
        return pvVar7;
      }
      if (pTVar8 <= pTVar9) break;
      uVar4 = (pTVar8->field_2).it;
      switch(uVar4 & 7) {
      default:
        pTVar8 = pTVar8 + (-1 - (ulong)*(byte *)((ulong)uVar4 - 3));
        goto LAB_00113b4c;
      case 2:
        if (pTVar8[-1].u32.lo != 1) goto switchD_00113b06_caseD_3;
      case 1:
        if (errcode != 0) {
          L->base = (TValue *)((long)pTVar8 + (8 - (long)(int)(uVar4 & 0xfffffff8)));
          L->cframe = *(void **)((long)pvVar7 + 0x30);
          unwindstack(L,pTVar8);
          return (void *)0x0;
        }
        if (pvVar7 == stopcf) {
          return (void *)0x0;
        }
        pvVar7 = *(void **)((long)pvVar7 + 0x30);
        uVar6 = (long)(int)uVar4 & 0xfffffffffffffff8;
        break;
      case 5:
        if (((ulong)pvVar7 & 1) != 0) {
          if (errcode != 0) {
            pbVar1 = (byte *)((ulong)(L->glref).ptr32 + 0x109);
            *pbVar1 = *pbVar1 & 0xef;
            L->cframe = (void *)0x0;
            L->status = (uint8_t)errcode;
            return pvVar7;
          }
          return pvVar7;
        }
        if (errcode == 0) {
          return pvVar7;
        }
        L->base = (TValue *)((long)pTVar8 + (8 - ((long)(int)uVar4 & 0xfffffffffffffff8U)));
        L->cframe = *(void **)((long)pvVar7 + 0x30);
        goto LAB_00113bcd;
      case 6:
      case 7:
        if (errcode != 1) {
          if (errcode != 0) {
            uVar6 = (ulong)(L->glref).ptr32;
            *(int *)(uVar6 + 0x188) = (int)L;
            uVar4 = (pTVar8->field_2).it;
            if ((uVar4 & 7) == 6) {
              pbVar1 = (byte *)(uVar6 + 0x109);
              *pbVar1 = *pbVar1 & 0xef;
              uVar4 = (pTVar8->field_2).it;
            }
            pTVar8 = (TValue *)((long)pTVar8 + (8 - (long)(int)(uVar4 & 0xfffffff8)));
            L->base = pTVar8;
            L->cframe = pvVar7;
            unwindstack(L,pTVar8);
          }
          return (void *)((ulong)pvVar7 | 2);
        }
      case 3:
switchD_00113b06_caseD_3:
        uVar6 = (ulong)(int)(uVar4 & 0xfffffff8);
      }
      pTVar8 = (TValue *)((long)pTVar8 - uVar6);
LAB_00113b4c:
    } while (pvVar7 != (void *)0x0);
  }
  if (errcode != 0) {
    pTVar8 = (TValue *)((ulong)(L->stack).ptr32 + 8);
    L->base = pTVar8;
    L->cframe = (void *)0x0;
    unwindstack(L,pTVar8);
    pcVar3 = *(code **)((ulong)(L->glref).ptr32 + 0x178);
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)(L);
    }
    exit(1);
  }
  return L;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	global_State *g;
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	g = G(L);
	setgcref(g->cur_L, obj2gco(L));
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(g);
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}